

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * call_function(Scope *scope,FunctionValue *function_value,TupleValue *parameter_values)

{
  Scope *scope_00;
  Value *pVVar1;
  ulong uVar2;
  
  scope_00 = new_scope(scope,function_value->block,ScopeTypeFunctionScope);
  if (function_value->argument_count < parameter_values->length) {
    pVVar1 = new_null_value();
    return pVVar1;
  }
  if (function_value->argument_count != 0) {
    uVar2 = 0;
    do {
      if (uVar2 < parameter_values->length) {
        pVVar1 = parameter_values->items[uVar2];
      }
      else {
        pVVar1 = new_null_value();
      }
      scope_set_variable(scope_00,ValueTypeNullValue,function_value->arguments[uVar2],pVVar1,1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < function_value->argument_count);
  }
  pVVar1 = evaluate_scope(scope_00);
  free_scope(scope_00);
  return pVVar1;
}

Assistant:

Value *call_function(Scope *scope, FunctionValue *function_value, TupleValue *parameter_values) {
  Scope *function_scope = new_scope(scope, function_value->block, ScopeTypeFunctionScope);

  if (parameter_values->length > function_value->argument_count) return new_null_value();

  Value *variable_value;

  for (size_t i = 0; i < function_value->argument_count; i++) {
    if (parameter_values->length <= i) {
      variable_value = new_null_value();
    }
    else {
      variable_value = parameter_values->items[i];
    }

    scope_set_variable(function_scope, ValueTypeNullValue, function_value->arguments[i], variable_value, true);
  }

  Value *result = evaluate_scope(function_scope);
  free_scope(function_scope);

  return result;
}